

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerTest.cpp
# Opt level: O1

void __thiscall TestClass::ProcessFunc2(TestClass *this,Event2 *ev)

{
  timeval curTime;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  return;
}

Assistant:

void TestClass::ProcessFunc2( Event2 *ev )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	LOG_NOTICE( "p1 %d p2 %d", ev->mP1, ev->mP2 );
	struct timeval curTime;
	TimeUtils::getCurTime( &curTime );
	
	int elapsed = TimeUtils::getDifference( &curTime, &ev->mSent );
	
	LOG("Received Func2 timed event, elapsed time is %d", elapsed);
}